

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memset_s.c
# Opt level: O3

int main(void)

{
  return 0;
}

Assistant:

int main( void )
{
#if ! defined( REGTEST ) || defined( __STDC_LIB_EXT1__ )
    char s[] = "xxxxxxxxx";
    set_constraint_handler_s( test_handler );

    TESTCASE( memset_s( s, 10, 'o', 10 ) == 0 );
    TESTCASE( s[9] == 'o' );
    TESTCASE( memset_s( s, 10, '_', ( 0 ) ) == 0 );
    TESTCASE( s[0] == 'o' );
    TESTCASE( memset_s( s, 10, '_', 1 ) == 0 );
    TESTCASE( s[0] == '_' );
    TESTCASE( s[1] == 'o' );

    TESTCASE( HANDLER_CALLS == 0 );
#endif
    return TEST_RESULTS;
}